

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3BtreeEnter(Btree *p)

{
  sqlite3_mutex *psVar1;
  int iVar2;
  Btree *p_00;
  
  if ((p->sharable == '\0') || (p->wantToLock = p->wantToLock + 1, p->locked != '\0')) {
    return;
  }
  psVar1 = p->pBt->mutex;
  if ((psVar1 != (sqlite3_mutex *)0x0) &&
     (iVar2 = (*sqlite3Config.mutex.xMutexTry)(psVar1), iVar2 != 0)) {
    for (p_00 = p->pNext; p_00 != (Btree *)0x0; p_00 = p_00->pNext) {
      if (p_00->locked != '\0') {
        unlockBtreeMutex(p_00);
      }
    }
    do {
      psVar1 = p->pBt->mutex;
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar1);
      }
      p->pBt->db = p->db;
      p->locked = '\x01';
      do {
        p = p->pNext;
        if (p == (Btree *)0x0) {
          return;
        }
      } while (p->wantToLock == 0);
    } while( true );
  }
  p->pBt->db = p->db;
  p->locked = '\x01';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BtreeEnter(Btree *p){
  /* Some basic sanity checking on the Btree.  The list of Btrees
  ** connected by pNext and pPrev should be in sorted order by
  ** Btree.pBt value. All elements of the list should belong to
  ** the same connection. Only shared Btrees are on the list. */
  assert( p->pNext==0 || p->pNext->pBt>p->pBt );
  assert( p->pPrev==0 || p->pPrev->pBt<p->pBt );
  assert( p->pNext==0 || p->pNext->db==p->db );
  assert( p->pPrev==0 || p->pPrev->db==p->db );
  assert( p->sharable || (p->pNext==0 && p->pPrev==0) );

  /* Check for locking consistency */
  assert( !p->locked || p->wantToLock>0 );
  assert( p->sharable || p->wantToLock==0 );

  /* We should already hold a lock on the database connection */
  assert( sqlite3_mutex_held(p->db->mutex) );

  /* Unless the database is sharable and unlocked, then BtShared.db
  ** should already be set correctly. */
  assert( (p->locked==0 && p->sharable) || p->pBt->db==p->db );

  if( !p->sharable ) return;
  p->wantToLock++;
  if( p->locked ) return;
  btreeLockCarefully(p);
}